

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(ON_SubDEdgePtr eptr)

{
  ON_SubDEdgeSharpness OVar1;
  ON_SubDEdgeTag OVar2;
  byte bVar3;
  undefined8 uVar4;
  ON_SubD_ComponentIdTypeAndTag OVar5;
  ON_SubD_ComponentIdTypeAndTag itt;
  
  OVar5 = CreateFromEdge((ON_SubDEdge *)(eptr.m_ptr & 0xfffffffffffffff8));
  OVar1 = OVar5.m_sharpness.m_edge_sharpness;
  itt.m_sharpness.m_edge_sharpness = OVar1.m_edge_sharpness;
  itt._8_8_ = OVar5._8_8_;
  OVar2 = EdgeTag(&itt);
  uVar4 = OVar5._8_8_;
  if (OVar2 != Unset) {
    bVar3 = 0x70;
    if ((eptr.m_ptr & 1) == 0) {
      bVar3 = 0;
    }
    itt.m_tag_and_dirx = bVar3 | OVar5.m_tag_and_dirx & 7;
    uVar4 = itt._8_8_;
  }
  OVar5.m_id = (uint)uVar4;
  OVar5.m_type = SUB81(uVar4,4);
  OVar5.m_tag_and_dirx = SUB81(uVar4,5);
  OVar5.m_reserved = SUB82(uVar4,6);
  OVar5.m_sharpness.m_edge_sharpness[0] = OVar1.m_edge_sharpness[0];
  OVar5.m_sharpness.m_edge_sharpness[1] = OVar1.m_edge_sharpness[1];
  return OVar5;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(const class ON_SubDEdgePtr eptr)
{
  ON_SubD_ComponentIdTypeAndTag itt = ON_SubD_ComponentIdTypeAndTag::CreateFromEdge(eptr.Edge());
  if (ON_SubDEdgeTag::Unset != itt.EdgeTag())
    itt.Internal_SetDir(0 == eptr.EdgeDirection() ? 0 : 1);
  return itt;
}